

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall
GameEngine::fillPopulationPattern
          (GameEngine *this,vector<LightPopulation,_std::allocator<LightPopulation>_> *populations)

{
  pointer psVar1;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  CellType *this_00;
  bool bVar3;
  int32_t y_pos;
  int32_t x_pos;
  pointer psVar4;
  size_t sVar5;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *pvVar6;
  RandomGenerator *pRVar7;
  ostream *poVar8;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar9;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  psVar1 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->players).
                super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    sVar5 = Player::getPopulationsNumber
                      ((psVar4->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (sVar5 == 0) {
      Player::generatePopulations
                ((psVar4->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    pvVar6 = Player::GetPlayerPopulations
                       ((psVar4->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    p_Var2 = &((pvVar6->
               super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var10 = &((pvVar6->
                     super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>; p_Var10 != p_Var2;
        p_Var10 = p_Var10 + 1) {
      pRVar7 = RandomGenerator::getInstance();
      sVar5 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      y_pos = RandomGenerator::randInt(pRVar7,0,(int)sVar5 + -1);
      pRVar7 = RandomGenerator::getInstance();
      sVar5 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      x_pos = RandomGenerator::randInt(pRVar7,0,(int)sVar5 + -1);
      uVar11 = 0;
      while( true ) {
        bVar3 = isPopulationExist(this,(long)x_pos,(long)y_pos);
        if ((!bVar3) || (9 < uVar11)) break;
        pRVar7 = RandomGenerator::getInstance();
        sVar5 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
        y_pos = RandomGenerator::randInt(pRVar7,0,(int)sVar5 + -1);
        pRVar7 = RandomGenerator::getInstance();
        sVar5 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             );
        x_pos = RandomGenerator::randInt(pRVar7,0,(int)sVar5 + -1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x_pos);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,y_pos);
        std::endl<char,std::char_traits<char>>(poVar8);
        uVar11 = uVar11 + 1;
      }
      poVar8 = std::operator<<((ostream *)&std::cout," End ");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x_pos);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,y_pos);
      std::endl<char,std::char_traits<char>>(poVar8);
      if (uVar11 == 10) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Cannot generate populations");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      Population::SetXPos(p_Var10->_M_ptr,x_pos);
      Population::SetYPos(p_Var10->_M_ptr,y_pos);
      pvVar9 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(long)y_pos);
      this_00 = (pvVar9->
                super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                )._M_impl.super__Vector_impl_data._M_start[x_pos].
                super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var10);
      CellType::setCurrentPopulation(this_00,(shared_ptr<Population> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::vector<LightPopulation,std::allocator<LightPopulation>>::emplace_back<Population&>
                ((vector<LightPopulation,std::allocator<LightPopulation>> *)populations,
                 p_Var10->_M_ptr);
    }
  }
  return;
}

Assistant:

void GameEngine::fillPopulationPattern(std::vector<LightPopulation> &populations) {
  for (const auto &player : players) {
    if (player->getPopulationsNumber() == 0) {
      player->generatePopulations();
    }

    for (const auto &population : player->GetPlayerPopulations()) {
      int32_t y = RandomGenerator::getInstance().randInt(0, map->getHeight() - 1);
      int32_t x = RandomGenerator::getInstance().randInt(0, map->getWidth() - 1);
      size_t step = 0;

      while (isPopulationExist(x, y) && step < 10) {
        y = RandomGenerator::getInstance().randInt(0, map->getHeight() - 1);
        x = RandomGenerator::getInstance().randInt(0, map->getWidth() - 1);
        std::cout << x << " " << y << std::endl;
        ++step;
      }
      std::cout << " End " << std::endl;
      std::cout << x << " " << y << std::endl;

      if (step == 10) {
        std::cerr << "Cannot generate populations" << std::endl;
      }

      population->SetXPos(x);
      population->SetYPos(y);
      (*map)[y][x]->setCurrentPopulation(population);

      populations.emplace_back(*population);
    }
  }
}